

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

void __thiscall Pyraminx::Pyraminx(Pyraminx *this)

{
  Eq_Pos_Table eq_pos_table;
  undefined1 local_9c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Eq_Pos_Table local_88;
  
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Eq_Pos_Table::Eq_Pos_Table(&local_88);
  local_9c._0_4_ = 1;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_9c + 4),(Eq_Pos_Table *)local_9c);
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  local_9c._0_4_ = 3;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_9c + 4),(Eq_Pos_Table *)local_9c);
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  local_9c._0_4_ = 2;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_9c + 4),(Eq_Pos_Table *)local_9c);
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  local_9c._0_4_ = 0;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_9c + 4),(Eq_Pos_Table *)local_9c);
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->blue_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->red_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->yellow_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->green_face);
  set_neighbors(this);
  Eq_Pos_Table::~Eq_Pos_Table(&local_88);
  return;
}

Assistant:

Pyraminx::Pyraminx(){
    Eq_Pos_Table eq_pos_table;

    blue_face = std::make_shared<Face>(Color::blue, eq_pos_table);
    red_face = std::make_shared<Face>(Color::red, eq_pos_table);
    yellow_face = std::make_shared<Face>(Color::yellow, eq_pos_table);
    green_face = std::make_shared<Face>(Color::green, eq_pos_table);

    face_list.push_back(blue_face);
    face_list.push_back(red_face);
    face_list.push_back(yellow_face);
    face_list.push_back(green_face); 
   set_neighbors();
}